

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::moveCom(Molecule *this,Vector3d *delta)

{
  Vector<double,_3U> *in_RDI;
  iterator i;
  StuntDouble *sd;
  StuntDouble *v;
  StuntDouble *in_stack_ffffffffffffff98;
  StuntDouble *in_stack_ffffffffffffffa0;
  iterator *in_stack_ffffffffffffffa8;
  Molecule *in_stack_ffffffffffffffb0;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  StuntDouble *local_18;
  
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_20);
  local_18 = beginIntegrableObject(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  while (local_18 != (StuntDouble *)0x0) {
    v = local_18;
    StuntDouble::getPos(in_stack_ffffffffffffff98);
    OpenMD::operator+((Vector<double,_3U> *)in_stack_ffffffffffffff98,in_RDI);
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,(Vector<double,_3U> *)v);
    StuntDouble::setPos(in_stack_ffffffffffffffa0,(Vector3d *)in_stack_ffffffffffffff98);
    local_18 = nextIntegrableObject(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void Molecule::moveCom(const Vector3d& delta) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      sd->setPos(sd->getPos() + delta);
    }
  }